

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::PackedInt32::_InternalSerialize
          (PackedInt32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int *piVar1;
  int iVar2;
  uint8_t *puVar3;
  const_pointer piVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  LogMessageFatal local_40;
  
  uVar7 = *(uint *)((long)&this->field_0 + 0x10);
  if (0 < (int)uVar7) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar3) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    puVar3[0] = 0x82;
    puVar3[1] = 0x80;
    puVar3[2] = '\x01';
    target = puVar3 + 4;
    for (; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-1] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar7;
    piVar4 = google::protobuf::RepeatedField<int>::data(&(this->field_0)._impl_.repeated_int32_);
    iVar2 = google::protobuf::RepeatedField<int>::size(&(this->field_0)._impl_.repeated_int32_);
    piVar1 = piVar4 + iVar2;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar6 = (ulong)*piVar4; target = pbVar5 + 1, 0x7f < uVar6; uVar6 = uVar6 >> 7) {
        *pbVar5 = (byte)uVar6 | 0x80;
        pbVar5 = target;
      }
      piVar4 = piVar4 + 1;
      *pbVar5 = (byte)uVar6;
    } while (piVar4 < piVar1);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) == 0) {
    return target;
  }
  uVar6 = uVar6 & 0xfffffffffffffffe;
  puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar6 + 8),*(int *)(uVar6 + 0x10),target);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL PackedInt32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const PackedInt32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.PackedInt32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 2048 [features = {
  {
    int byte_size = this_._impl_._repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2048, this_._internal_repeated_int32(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.PackedInt32)
  return target;
}